

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int refs2id(refs_t *r,SAM_hdr *h)

{
  uint uVar1;
  uint uVar2;
  kh_refs_t *pkVar3;
  char *__s2;
  khint32_t *pkVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  ref_entry **pprVar8;
  byte bVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  
  if (r->ref_id != (ref_entry **)0x0) {
    free(r->ref_id);
  }
  if (r->last != (ref_entry *)0x0) {
    r->last = (ref_entry *)0x0;
  }
  iVar13 = h->nref;
  pprVar8 = (ref_entry **)calloc((long)iVar13,8);
  r->ref_id = pprVar8;
  if (pprVar8 == (ref_entry **)0x0) {
    iVar13 = -1;
  }
  else {
    r->nref = iVar13;
    if (0 < h->nref) {
      lVar12 = 0;
      do {
        pkVar3 = r->h_meta;
        __s2 = h->ref[lVar12].name;
        uVar1 = pkVar3->n_buckets;
        uVar6 = 0;
        if (uVar1 != 0) {
          uVar14 = (uint)*__s2;
          if (*__s2 == '\0') {
            uVar14 = 0;
          }
          else {
            cVar5 = __s2[1];
            if (cVar5 != '\0') {
              pcVar10 = __s2 + 2;
              do {
                uVar14 = (int)cVar5 + uVar14 * 0x1f;
                cVar5 = *pcVar10;
                pcVar10 = pcVar10 + 1;
              } while (cVar5 != '\0');
            }
          }
          uVar14 = uVar14 & uVar1 - 1;
          pkVar4 = pkVar3->flags;
          iVar13 = 1;
          uVar11 = uVar14;
          do {
            uVar2 = pkVar4[uVar11 >> 4];
            bVar9 = (char)uVar11 * '\x02' & 0x1e;
            uVar6 = uVar2 >> bVar9;
            if (((uVar6 & 2) != 0) ||
               (((uVar6 & 1) == 0 && (iVar7 = strcmp(pkVar3->keys[uVar11],__s2), iVar7 == 0)))) {
              uVar6 = uVar11;
              if ((uVar2 >> bVar9 & 3) != 0) {
                uVar6 = uVar1;
              }
              break;
            }
            uVar11 = uVar11 + iVar13 & uVar1 - 1;
            iVar13 = iVar13 + 1;
            uVar6 = uVar1;
          } while (uVar11 != uVar14);
        }
        if (uVar6 == uVar1) {
          fprintf(_stderr,"Unable to find ref name \'%s\'\n",__s2);
        }
        else {
          r->ref_id[lVar12] = pkVar3->vals[uVar6];
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < h->nref);
    }
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

int refs2id(refs_t *r, SAM_hdr *h) {
    int i;

    if (r->ref_id)
	free(r->ref_id);
    if (r->last)
	r->last = NULL;

    r->ref_id = calloc(h->nref, sizeof(*r->ref_id));
    if (!r->ref_id)
	return -1;

    r->nref = h->nref;
    for (i = 0; i < h->nref; i++) {
	khint_t k = kh_get(refs, r->h_meta, h->ref[i].name);
	if (k != kh_end(r->h_meta)) {
	    r->ref_id[i] = kh_val(r->h_meta, k);
	} else {
	    fprintf(stderr, "Unable to find ref name '%s'\n",
		    h->ref[i].name);
	}
    }

    return 0;
}